

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::asBool(Value *this)

{
  byte bVar1;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [376];
  
  switch(this->field_0x8) {
  case 0:
    bVar1 = 0;
    break;
  case 1:
  case 2:
  case 3:
    bVar1 = (this->value_).int_ != 0;
    break;
  case 4:
    bVar1 = -((this->value_).real_ != 0.0) & 1;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::operator<<((ostream *)local_180,"Value is not convertible to bool.");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::ostringstream::~ostringstream(local_180);
    _Unwind_Resume(extraout_RAX);
  case 6:
    bVar1 = (this->value_).bool_;
  }
  return (bool)bVar1;
}

Assistant:

bool Value::asBool() const {
  switch (type_) {
  case booleanValue:
    return value_.bool_;
  case nullValue:
    return false;
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    return value_.int_ ? true : false;
  case uintValue:
    return value_.uint_ ? true : false;
  case realValue:
    return value_.real_ ? true : false;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to bool.");
}